

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O1

bool __thiscall
ImPlot::
ShadedRenderer<ImPlot::GetterXsYs<float>,_ImPlot::GetterXsYs<float>,_ImPlot::TransformerLinLog>::
operator()(ShadedRenderer<ImPlot::GetterXsYs<float>,_ImPlot::GetterXsYs<float>,_ImPlot::TransformerLinLog>
           *this,ImDrawList *DrawList,ImRect *param_2,ImVec2 *uv,int prim)

{
  float fVar1;
  float fVar2;
  double dVar3;
  int iVar4;
  GetterXsYs<float> *pGVar5;
  TransformerLinLog *pTVar6;
  ImPlotPlot *pIVar7;
  ImDrawVert *pIVar8;
  uint *puVar9;
  ImVec2 IVar10;
  double dVar11;
  ImVec2 IVar12;
  ImPlotContext *pIVar13;
  ImPlotContext *pIVar14;
  uint uVar15;
  long lVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  
  pIVar13 = GImPlot;
  pGVar5 = this->Getter1;
  pTVar6 = this->Transformer;
  iVar4 = pGVar5->Count;
  lVar16 = (long)(((pGVar5->Offset + prim + 1) % iVar4 + iVar4) % iVar4) * (long)pGVar5->Stride;
  fVar19 = *(float *)((long)pGVar5->Xs + lVar16);
  dVar11 = log10((double)*(float *)((long)pGVar5->Ys + lVar16) /
                 GImPlot->CurrentPlot->YAxis[pTVar6->YAxis].Range.Min);
  pIVar14 = GImPlot;
  iVar4 = pTVar6->YAxis;
  pIVar7 = pIVar13->CurrentPlot;
  dVar3 = pIVar7->YAxis[iVar4].Range.Min;
  fVar20 = (float)(((double)fVar19 - (pIVar7->XAxis).Range.Min) * pIVar13->Mx +
                  (double)pIVar13->PixelRange[iVar4].Min.x);
  fVar18 = (float)((((double)(float)(dVar11 / pIVar13->LogDenY[iVar4]) *
                     (pIVar7->YAxis[iVar4].Range.Max - dVar3) + dVar3) - dVar3) * pIVar13->My[iVar4]
                  + (double)pIVar13->PixelRange[iVar4].Min.y);
  pGVar5 = this->Getter2;
  pTVar6 = this->Transformer;
  iVar4 = pGVar5->Count;
  lVar16 = (long)(((prim + 1 + pGVar5->Offset) % iVar4 + iVar4) % iVar4) * (long)pGVar5->Stride;
  fVar19 = *(float *)((long)pGVar5->Xs + lVar16);
  dVar11 = log10((double)*(float *)((long)pGVar5->Ys + lVar16) /
                 GImPlot->CurrentPlot->YAxis[pTVar6->YAxis].Range.Min);
  iVar4 = pTVar6->YAxis;
  pIVar7 = pIVar14->CurrentPlot;
  dVar3 = pIVar7->YAxis[iVar4].Range.Min;
  fVar17 = (float)(((double)fVar19 - (pIVar7->XAxis).Range.Min) * pIVar14->Mx +
                  (double)pIVar14->PixelRange[iVar4].Min.x);
  fVar22 = (float)((((double)(float)(dVar11 / pIVar14->LogDenY[iVar4]) *
                     (pIVar7->YAxis[iVar4].Range.Max - dVar3) + dVar3) - dVar3) * pIVar14->My[iVar4]
                  + (double)pIVar14->PixelRange[iVar4].Min.y);
  fVar19 = (this->P12).x;
  fVar21 = fVar19 - fVar17;
  fVar24 = (this->P11).x;
  fVar1 = (this->P11).y;
  fVar2 = (this->P12).y;
  fVar25 = fVar24 * fVar18 - fVar20 * fVar1;
  fVar19 = fVar19 * fVar22 - fVar17 * fVar2;
  fVar24 = fVar24 - fVar20;
  fVar23 = fVar24 * (fVar2 - fVar22) - fVar21 * (fVar1 - fVar18);
  DrawList->_VtxWritePtr->pos = this->P11;
  DrawList->_VtxWritePtr->uv = *uv;
  pIVar8 = DrawList->_VtxWritePtr;
  pIVar8->col = this->Col;
  pIVar8[1].pos.x = fVar20;
  pIVar8[1].pos.y = fVar18;
  DrawList->_VtxWritePtr[1].uv = *uv;
  pIVar8 = DrawList->_VtxWritePtr;
  pIVar8[1].col = this->Col;
  IVar12.y = ((fVar2 - fVar22) * fVar25 - (fVar1 - fVar18) * fVar19) / fVar23;
  IVar12.x = (fVar25 * fVar21 - fVar24 * fVar19) / fVar23;
  pIVar8[2].pos = IVar12;
  DrawList->_VtxWritePtr[2].uv = *uv;
  pIVar8 = DrawList->_VtxWritePtr;
  pIVar8[2].col = this->Col;
  pIVar8[3].pos = this->P12;
  DrawList->_VtxWritePtr[3].uv = *uv;
  pIVar8 = DrawList->_VtxWritePtr;
  pIVar8[3].col = this->Col;
  IVar10.y = fVar22;
  IVar10.x = fVar17;
  pIVar8[4].pos = IVar10;
  DrawList->_VtxWritePtr[4].uv = *uv;
  pIVar8 = DrawList->_VtxWritePtr;
  pIVar8[4].col = this->Col;
  DrawList->_VtxWritePtr = pIVar8 + 5;
  puVar9 = DrawList->_IdxWritePtr;
  *puVar9 = DrawList->_VtxCurrentIdx;
  uVar15 = -(uint)(fVar2 < fVar1 && fVar18 < fVar22 || fVar1 < fVar2 && fVar22 < fVar18) & 1;
  puVar9[1] = DrawList->_VtxCurrentIdx + uVar15 + 1;
  puVar9[2] = DrawList->_VtxCurrentIdx + 3;
  puVar9[3] = DrawList->_VtxCurrentIdx + 1;
  puVar9[4] = (uVar15 ^ 3) + DrawList->_VtxCurrentIdx;
  puVar9[5] = DrawList->_VtxCurrentIdx + 4;
  DrawList->_IdxWritePtr = puVar9 + 6;
  DrawList->_VtxCurrentIdx = DrawList->_VtxCurrentIdx + 5;
  (this->P11).x = fVar20;
  (this->P11).y = fVar18;
  (this->P12).x = fVar17;
  (this->P12).y = fVar22;
  return true;
}

Assistant:

inline bool operator()(ImDrawList& DrawList, const ImRect& /*cull_rect*/, const ImVec2& uv, int prim) const {
        // TODO: Culling
        ImVec2 P21 = Transformer(Getter1(prim+1));
        ImVec2 P22 = Transformer(Getter2(prim+1));
        const int intersect = (P11.y > P12.y && P22.y > P21.y) || (P12.y > P11.y && P21.y > P22.y);
        ImVec2 intersection = Intersection(P11,P21,P12,P22);
        DrawList._VtxWritePtr[0].pos = P11;
        DrawList._VtxWritePtr[0].uv  = uv;
        DrawList._VtxWritePtr[0].col = Col;
        DrawList._VtxWritePtr[1].pos = P21;
        DrawList._VtxWritePtr[1].uv  = uv;
        DrawList._VtxWritePtr[1].col = Col;
        DrawList._VtxWritePtr[2].pos = intersection;
        DrawList._VtxWritePtr[2].uv  = uv;
        DrawList._VtxWritePtr[2].col = Col;
        DrawList._VtxWritePtr[3].pos = P12;
        DrawList._VtxWritePtr[3].uv  = uv;
        DrawList._VtxWritePtr[3].col = Col;
        DrawList._VtxWritePtr[4].pos = P22;
        DrawList._VtxWritePtr[4].uv  = uv;
        DrawList._VtxWritePtr[4].col = Col;
        DrawList._VtxWritePtr += 5;
        DrawList._IdxWritePtr[0] = (ImDrawIdx)(DrawList._VtxCurrentIdx);
        DrawList._IdxWritePtr[1] = (ImDrawIdx)(DrawList._VtxCurrentIdx + 1 + intersect);
        DrawList._IdxWritePtr[2] = (ImDrawIdx)(DrawList._VtxCurrentIdx + 3);
        DrawList._IdxWritePtr[3] = (ImDrawIdx)(DrawList._VtxCurrentIdx + 1);
        DrawList._IdxWritePtr[4] = (ImDrawIdx)(DrawList._VtxCurrentIdx + 3 - intersect);
        DrawList._IdxWritePtr[5] = (ImDrawIdx)(DrawList._VtxCurrentIdx + 4);
        DrawList._IdxWritePtr += 6;
        DrawList._VtxCurrentIdx += 5;
        P11 = P21;
        P12 = P22;
        return true;
    }